

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall Proxy::Connect(Proxy *this)

{
  long lVar1;
  bool bVar2;
  Sock *pSVar3;
  size_type sVar4;
  pointer *__ptr;
  Proxy *in_RSI;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  undefined1 local_b8 [10];
  sockaddr_un addrun;
  string path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValid(in_RSI);
  if (bVar2) {
    if (in_RSI->m_is_unix_socket == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        ConnectDirectly(&this->proxy,SUB81(in_RSI,0));
        return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
               (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
      }
      goto LAB_0059c151;
    }
    std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
              ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
               local_b8,0xa38640,1,1);
    if ((Sock *)local_b8._0_8_ == (Sock *)0x0) {
      bVar2 = ::LogAcceptCategory(NET,Error);
      if (bVar2) {
        logging_function._M_str = "Connect";
        logging_function._M_len = 7;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file._M_len = 0x54;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0x290,NET,Error,
                   "Cannot create a socket for connecting to %s\n",&in_RSI->m_unix_socket_path);
      }
      (this->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&path,&in_RSI->m_unix_socket_path,::ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length,
                 0xffffffffffffffff);
      addrun.sun_path[0x60] = '\0';
      addrun.sun_path[0x61] = '\0';
      addrun.sun_path[0x62] = '\0';
      addrun.sun_path[99] = '\0';
      addrun.sun_path[100] = '\0';
      addrun.sun_path[0x65] = '\0';
      addrun.sun_path[0x66] = '\0';
      addrun.sun_path[0x67] = '\0';
      addrun.sun_path[0x68] = '\0';
      addrun.sun_path[0x69] = '\0';
      addrun.sun_path[0x6a] = '\0';
      addrun.sun_path[0x6b] = '\0';
      addrun.sun_path[0x50] = '\0';
      addrun.sun_path[0x51] = '\0';
      addrun.sun_path[0x52] = '\0';
      addrun.sun_path[0x53] = '\0';
      addrun.sun_path[0x54] = '\0';
      addrun.sun_path[0x55] = '\0';
      addrun.sun_path[0x56] = '\0';
      addrun.sun_path[0x57] = '\0';
      addrun.sun_path[0x58] = '\0';
      addrun.sun_path[0x59] = '\0';
      addrun.sun_path[0x5a] = '\0';
      addrun.sun_path[0x5b] = '\0';
      addrun.sun_path[0x5c] = '\0';
      addrun.sun_path[0x5d] = '\0';
      addrun.sun_path[0x5e] = '\0';
      addrun.sun_path[0x5f] = '\0';
      addrun.sun_path[0x40] = '\0';
      addrun.sun_path[0x41] = '\0';
      addrun.sun_path[0x42] = '\0';
      addrun.sun_path[0x43] = '\0';
      addrun.sun_path[0x44] = '\0';
      addrun.sun_path[0x45] = '\0';
      addrun.sun_path[0x46] = '\0';
      addrun.sun_path[0x47] = '\0';
      addrun.sun_path[0x48] = '\0';
      addrun.sun_path[0x49] = '\0';
      addrun.sun_path[0x4a] = '\0';
      addrun.sun_path[0x4b] = '\0';
      addrun.sun_path[0x4c] = '\0';
      addrun.sun_path[0x4d] = '\0';
      addrun.sun_path[0x4e] = '\0';
      addrun.sun_path[0x4f] = '\0';
      addrun.sun_path[0x30] = '\0';
      addrun.sun_path[0x31] = '\0';
      addrun.sun_path[0x32] = '\0';
      addrun.sun_path[0x33] = '\0';
      addrun.sun_path[0x34] = '\0';
      addrun.sun_path[0x35] = '\0';
      addrun.sun_path[0x36] = '\0';
      addrun.sun_path[0x37] = '\0';
      addrun.sun_path[0x38] = '\0';
      addrun.sun_path[0x39] = '\0';
      addrun.sun_path[0x3a] = '\0';
      addrun.sun_path[0x3b] = '\0';
      addrun.sun_path[0x3c] = '\0';
      addrun.sun_path[0x3d] = '\0';
      addrun.sun_path[0x3e] = '\0';
      addrun.sun_path[0x3f] = '\0';
      addrun.sun_path[0x20] = '\0';
      addrun.sun_path[0x21] = '\0';
      addrun.sun_path[0x22] = '\0';
      addrun.sun_path[0x23] = '\0';
      addrun.sun_path[0x24] = '\0';
      addrun.sun_path[0x25] = '\0';
      addrun.sun_path[0x26] = '\0';
      addrun.sun_path[0x27] = '\0';
      addrun.sun_path[0x28] = '\0';
      addrun.sun_path[0x29] = '\0';
      addrun.sun_path[0x2a] = '\0';
      addrun.sun_path[0x2b] = '\0';
      addrun.sun_path[0x2c] = '\0';
      addrun.sun_path[0x2d] = '\0';
      addrun.sun_path[0x2e] = '\0';
      addrun.sun_path[0x2f] = '\0';
      addrun.sun_path[0x10] = '\0';
      addrun.sun_path[0x11] = '\0';
      addrun.sun_path[0x12] = '\0';
      addrun.sun_path[0x13] = '\0';
      addrun.sun_path[0x14] = '\0';
      addrun.sun_path[0x15] = '\0';
      addrun.sun_path[0x16] = '\0';
      addrun.sun_path[0x17] = '\0';
      addrun.sun_path[0x18] = '\0';
      addrun.sun_path[0x19] = '\0';
      addrun.sun_path[0x1a] = '\0';
      addrun.sun_path[0x1b] = '\0';
      addrun.sun_path[0x1c] = '\0';
      addrun.sun_path[0x1d] = '\0';
      addrun.sun_path[0x1e] = '\0';
      addrun.sun_path[0x1f] = '\0';
      addrun.sun_path[0] = '\0';
      addrun.sun_path[1] = '\0';
      addrun.sun_path[2] = '\0';
      addrun.sun_path[3] = '\0';
      addrun.sun_path[4] = '\0';
      addrun.sun_path[5] = '\0';
      addrun.sun_path[6] = '\0';
      addrun.sun_path[7] = '\0';
      addrun.sun_path[8] = '\0';
      addrun.sun_path[9] = '\0';
      addrun.sun_path[10] = '\0';
      addrun.sun_path[0xb] = '\0';
      addrun.sun_path[0xc] = '\0';
      addrun.sun_path[0xd] = '\0';
      addrun.sun_path[0xe] = '\0';
      addrun.sun_path[0xf] = '\0';
      addrun.sun_family = 1;
      sVar4 = 0x6b;
      if (path._M_string_length < 0x6b) {
        sVar4 = path._M_string_length;
      }
      __memcpy_chk(addrun.sun_path,path._M_dataplus._M_p,sVar4,0x6c);
      bVar2 = ConnectToSocket((Sock *)local_b8._0_8_,(sockaddr *)&addrun,0x6e,&path,true);
      pSVar3 = (Sock *)local_b8._0_8_;
      if (bVar2) {
        local_b8._0_8_ = (Sock *)0x0;
      }
      else {
        pSVar3 = (Sock *)0x0;
      }
      (this->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)pSVar3;
      std::__cxx11::string::~string((string *)&path);
    }
    if ((Sock *)local_b8._0_8_ != (Sock *)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  else {
    (this->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
  }
LAB_0059c151:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Proxy::Connect() const
{
    if (!IsValid()) return {};

    if (!m_is_unix_socket) return ConnectDirectly(proxy, /*manual_connection=*/true);

#ifdef HAVE_SOCKADDR_UN
    auto sock = CreateSock(AF_UNIX, SOCK_STREAM, 0);
    if (!sock) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "Cannot create a socket for connecting to %s\n", m_unix_socket_path);
        return {};
    }

    const std::string path{m_unix_socket_path.substr(ADDR_PREFIX_UNIX.length())};

    struct sockaddr_un addrun;
    memset(&addrun, 0, sizeof(addrun));
    addrun.sun_family = AF_UNIX;
    // leave the last char in addrun.sun_path[] to be always '\0'
    memcpy(addrun.sun_path, path.c_str(), std::min(sizeof(addrun.sun_path) - 1, path.length()));
    socklen_t len = sizeof(addrun);

    if(!ConnectToSocket(*sock, (struct sockaddr*)&addrun, len, path, /*manual_connection=*/true)) {
        return {};
    }

    return sock;
#else
    return {};
#endif
}